

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O3

void __thiscall
embree::fast_allocator_regression_test::fast_allocator_regression_test
          (fast_allocator_regression_test *this)

{
  RegressionTest *test;
  long local_40;
  
  test = (RegressionTest *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffb8,"fast_allocator_regression_test","");
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_02185b78
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,test,
             (undefined1 *)((long)&test->_vptr_RegressionTest + local_40));
  if (test != (RegressionTest *)&stack0xffffffffffffffc8) {
    operator_delete(test);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_02185b38;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->alloc)._M_t.
  super___uniq_ptr_impl<embree::FastAllocator,_std::default_delete<embree::FastAllocator>_>._M_t.
  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>.
  super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl = (FastAllocator *)0x0;
  registerRegressionTest(test);
  return;
}

Assistant:

fast_allocator_regression_test() 
      : RegressionTest("fast_allocator_regression_test"), numFailed(0)
    {
      registerRegressionTest(this);
    }